

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O1

void __thiscall spvtools::opt::analysis::ArrayConstant::~ArrayConstant(ArrayConstant *this)

{
  pointer ppCVar1;
  
  (this->super_CompositeConstant).super_Constant._vptr_Constant =
       (_func_int **)&PTR__CompositeConstant_003ef958;
  ppCVar1 = (this->super_CompositeConstant).components_.
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1,(long)(this->super_CompositeConstant).components_.
                                  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar1
                   );
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

ArrayConstant(const Array* ty) : CompositeConstant(ty) {}